

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O2

void __thiscall ZXing::BitMatrix::rotate90(BitMatrix *this)

{
  bool bVar1;
  int x;
  uint x_00;
  int y;
  int y_00;
  BitMatrix result;
  
  BitMatrix(&result,this->_height,this->_width);
  for (x_00 = 0; (int)x_00 < this->_width; x_00 = x_00 + 1) {
    for (y_00 = 0; y_00 < this->_height; y_00 = y_00 + 1) {
      bVar1 = get(this,x_00,y_00);
      if (bVar1) {
        set(&result,y_00,this->_width + ~x_00,true);
      }
    }
  }
  operator=(this,&result);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void
BitMatrix::rotate90()
{
	BitMatrix result(height(), width());
	for (int x = 0; x < width(); ++x) {
		for (int y = 0; y < height(); ++y) {
			if (get(x, y)) {
				result.set(y, width() - x - 1);
			}
		}
	}
	*this = std::move(result);
}